

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::GenVarsT::GenVarsT
          (GenVarsT *this,GenT gen,string *genName,string *genNameUpper)

{
  string *genNameUpper_local;
  string *genName_local;
  GenT gen_local;
  GenVarsT *this_local;
  
  this->Enabled = false;
  this->Gen = gen;
  this->GenName = genName;
  this->GenNameUpper = genNameUpper;
  std::__cxx11::string::string((string *)&this->ExecutableTargetName);
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  std::__cxx11::string::string((string *)&this->Executable);
  this->ExecutableExists = false;
  return;
}

Assistant:

GenVarsT(GenT gen, std::string const& genName,
             std::string const& genNameUpper)
      : Gen(gen)
      , GenName(genName)
      , GenNameUpper(genNameUpper){}